

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_srlr_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 1L << ((char)df + 3U & 0x3f);
  bVar2 = -(char)lVar4;
  uVar1 = (ulong)(arg1 << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
  uVar5 = lVar4 + 0xffffffffU & arg2;
  uVar3 = uVar5 & 0xffffffff;
  if (uVar3 != 0) {
    uVar1 = (uVar1 >> ((byte)uVar3 & 0x3f)) +
            (ulong)((uVar1 >> ((ulong)((int)uVar5 - 1) & 0x3f) & 1) != 0);
  }
  return uVar1;
}

Assistant:

static inline int64_t msa_srlr_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    uint64_t u_arg1 = UNSIGNED(arg1, df);
    int32_t b_arg2 = BIT_POSITION(arg2, df);
    if (b_arg2 == 0) {
        return u_arg1;
    } else {
        uint64_t r_bit = (u_arg1 >> (b_arg2 - 1)) & 1;
        return (u_arg1 >> b_arg2) + r_bit;
    }
}